

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

bool __thiscall
flatbuffers::go::GoGenerator::generateStructs(GoGenerator *this,string *one_file_code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructDef *struct_def;
  bool bVar2;
  Parser *pPVar3;
  pointer ppSVar4;
  bool bVar5;
  string declcode;
  string local_60;
  set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
  *local_40;
  string *local_38;
  
  pPVar3 = (this->super_BaseGenerator).parser_;
  ppSVar4 = (pPVar3->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar5 = ppSVar4 ==
          (pPVar3->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar5) {
    local_40 = &this->tracked_imported_namespaces_;
    paVar1 = &local_60.field_2;
    local_38 = one_file_code;
    do {
      if ((pPVar3->opts).one_file == false) {
        std::
        _Rb_tree<const_flatbuffers::Definition_*,_const_flatbuffers::Definition_*,_std::_Identity<const_flatbuffers::Definition_*>,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
        ::clear(&local_40->_M_t);
        this->needs_math_import_ = false;
        this->needs_bytes_import_ = false;
      }
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      struct_def = *ppSVar4;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      GenStruct(this,struct_def,&local_60);
      if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
        std::__cxx11::string::_M_append((char *)local_38,(ulong)local_60._M_dataplus._M_p);
      }
      else {
        bVar2 = SaveType(this,&struct_def->super_Definition,&local_60,true,false);
        if (!bVar2) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p == paVar1) {
            return bVar5;
          }
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
          return bVar5;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      ppSVar4 = ppSVar4 + 1;
      pPVar3 = (this->super_BaseGenerator).parser_;
      bVar5 = ppSVar4 ==
              (pPVar3->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar5);
  }
  return bVar5;
}

Assistant:

bool generateStructs(std::string *one_file_code) {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      if (!parser_.opts.one_file) { ResetImports(); }
      std::string declcode;
      auto &struct_def = **it;
      GenStruct(struct_def, &declcode);
      if (parser_.opts.one_file) {
        *one_file_code += declcode;
      } else {
        if (!SaveType(struct_def, declcode, true, false)) return false;
      }
    }
    return true;
  }